

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O0

void __thiscall UnifiedRegex::RegexStats::Add(RegexStats *this,RegexStats *other)

{
  int local_20;
  int local_1c;
  int i_1;
  int i;
  RegexStats *other_local;
  RegexStats *this_local;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    this->phaseTicks[local_1c] = other->phaseTicks[local_1c] + this->phaseTicks[local_1c];
  }
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    this->useCounts[local_20] = other->useCounts[local_20] + this->useCounts[local_20];
  }
  this->inputLength = other->inputLength + this->inputLength;
  this->numCompares = other->numCompares + this->numCompares;
  this->numPushes = other->numPushes + this->numPushes;
  this->numPops = other->numPops + this->numPops;
  if (this->stackHWM < other->stackHWM) {
    this->stackHWM = other->stackHWM;
  }
  this->numInsts = other->numInsts + this->numInsts;
  return;
}

Assistant:

void RegexStats::Add(RegexStats* other)
    {
        for (int i = 0; i < NumPhases; i++)
            phaseTicks[i] += other->phaseTicks[i];
        for (int i = 0; i < NumUses; i++)
            useCounts[i] += other->useCounts[i];
        inputLength += other->inputLength;
        numCompares += other->numCompares;
        numPushes += other->numPushes;
        numPops += other->numPops;
        if (other->stackHWM > stackHWM)
            stackHWM = other->stackHWM;
        numInsts += other->numInsts;
    }